

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testRenameChannels(void)

{
  ostream *this;
  DeepImageLevel *pDVar1;
  SampleCountChannel *pSVar2;
  TypedDeepImageChannel<Imath_3_2::half> *pTVar3;
  mapped_type *pmVar4;
  string *psVar5;
  long lVar6;
  key_type *__k;
  allocator<char> *__a;
  float fVar7;
  RenamingMap oldToNewNames_2;
  RenamingMap oldToNewNames_1;
  bool caught;
  RenamingMap oldToNewNames;
  DeepImage img;
  float in_stack_fffffffffffff69c;
  Vec2<int> *in_stack_fffffffffffff6a0;
  string *in_stack_fffffffffffff6a8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff6b0;
  allocator<char> *in_stack_fffffffffffff6d0;
  key_type *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_5c9;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [86];
  undefined1 local_54a;
  undefined1 local_549 [40];
  allocator<char> local_521;
  string local_520 [39];
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [87];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  Vec2<int> local_88;
  Vec2<int> local_80;
  Box local_78 [16];
  DeepImage local_68 [104];
  
  this = std::operator<<((ostream *)&std::cout,"renaming multiple channels at the same time");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_80,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_88,10,10);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffff6b0,(Vec2<int> *)in_stack_fffffffffffff6a8,
             in_stack_fffffffffffff6a0);
  Imf_3_2::DeepImage::DeepImage(local_68,local_78,MIPMAP_LEVELS,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  Imf_3_2::Image::insertChannel((string *)local_68,(PixelType)local_a8,1,1,true);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  Imf_3_2::Image::insertChannel((string *)local_68,(PixelType)local_e0,1,1,true);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  Imf_3_2::Image::insertChannel((string *)local_68,(PixelType)local_108,1,1,true);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  Imf_3_2::Image::insertChannel((string *)local_68,(PixelType)local_130,1,1,true);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  pDVar1 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)local_68);
  pSVar2 = Imf_3_2::DeepImageLevel::sampleCounts(pDVar1);
  Imf_3_2::SampleCountChannel::set((int)pSVar2,0,0);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pDVar1 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)local_68);
  pSVar2 = Imf_3_2::DeepImageLevel::sampleCounts(pDVar1);
  Imf_3_2::SampleCountChannel::set((int)pSVar2,0,0);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  Imath_3_2::half::operator=((half *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x11266d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::__cxx11::string::operator=((string *)pmVar4,"B");
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::__cxx11::string::operator=((string *)pmVar4,"A");
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::__cxx11::string::operator=((string *)pmVar4,"E");
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::__cxx11::string::operator=((string *)pmVar4,"Y");
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  Imf_3_2::Image::renameChannels((map *)local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x112899);
  psVar5 = (string *)Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  lVar6 = Imf_3_2::DeepImageLevel::findChannel(psVar5);
  if (lVar6 == 0) {
    __assert_fail("img.level (0).findChannel (\"A\") != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x270,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  psVar5 = (string *)Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  lVar6 = Imf_3_2::DeepImageLevel::findChannel(psVar5);
  if (lVar6 == 0) {
    __assert_fail("img.level (0).findChannel (\"B\") != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x271,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  psVar5 = (string *)Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  lVar6 = Imf_3_2::DeepImageLevel::findChannel(psVar5);
  if (lVar6 != 0) {
    __assert_fail("img.level (0).findChannel (\"C\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x272,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  psVar5 = (string *)Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  lVar6 = Imf_3_2::DeepImageLevel::findChannel(psVar5);
  if (lVar6 == 0) {
    __assert_fail("img.level (0).findChannel (\"D\") != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x273,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  psVar5 = (string *)Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  lVar6 = Imf_3_2::DeepImageLevel::findChannel(psVar5);
  if (lVar6 == 0) {
    __assert_fail("img.level (0).findChannel (\"E\") != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x274,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
  if ((fVar7 != 2.0) || (NAN(fVar7))) {
    __assert_fail("img.level (0).typedChannel<half> (\"A\").at (0, 0)[0] == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x276,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
  if ((fVar7 != 1.0) || (NAN(fVar7))) {
    __assert_fail("img.level (0).typedChannel<half> (\"B\").at (0, 0)[0] == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x277,"void (anonymous namespace)::testRenameChannels()");
  }
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  Imf_3_2::DeepImage::level((int)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                     ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
  fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
  if ((fVar7 == 4.0) && (!NAN(fVar7))) {
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator(&local_481);
    Imf_3_2::DeepImage::level((int)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0
              );
    pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
    fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
    if ((fVar7 != 3.0) || (NAN(fVar7))) {
      __assert_fail("img.level (0).typedChannel<half> (\"E\").at (0, 0)[0] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x279,"void (anonymous namespace)::testRenameChannels()");
    }
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    Imf_3_2::DeepImage::level((int)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0
              );
    pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
    fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
    if ((fVar7 != 2.0) || (NAN(fVar7))) {
      __assert_fail("img.level (1).typedChannel<half> (\"A\").at (0, 0)[0] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x27b,"void (anonymous namespace)::testRenameChannels()");
    }
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    Imf_3_2::DeepImage::level((int)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0
              );
    pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
    fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
    if ((fVar7 != 1.0) || (NAN(fVar7))) {
      __assert_fail("img.level (1).typedChannel<half> (\"B\").at (0, 0)[0] == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x27c,"void (anonymous namespace)::testRenameChannels()");
    }
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    Imf_3_2::DeepImage::level((int)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0
              );
    pTVar3 = Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                       ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)pTVar3,0);
    fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
    if ((fVar7 == 4.0) && (!NAN(fVar7))) {
      std::__cxx11::string::~string(local_520);
      std::allocator<char>::~allocator(&local_521);
      Imf_3_2::DeepImage::level((int)local_68);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_549;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
      __k = (key_type *)
            Imf_3_2::DeepImageLevel::typedChannel<Imath_3_2::half>
                      ((DeepImageLevel *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
      __a = (allocator<char> *)Imf_3_2::TypedDeepImageChannel<Imath_3_2::half>::at((int)__k,0);
      fVar7 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffff6a0);
      if ((fVar7 == 3.0) && (!NAN(fVar7))) {
        std::__cxx11::string::~string((string *)(local_549 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_549);
        local_54a = 0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x113bc7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,__a);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00,__k);
        std::__cxx11::string::operator=((string *)pmVar4,"F");
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator(&local_5a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,__a);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00,__k);
        std::__cxx11::string::operator=((string *)pmVar4,"F");
        std::__cxx11::string::~string(local_5c8);
        std::allocator<char>::~allocator(&local_5c9);
        Imf_3_2::Image::renameChannels((map *)local_68);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0x288,"void (anonymous namespace)::testRenameChannels()");
      }
      __assert_fail("img.level (1).typedChannel<half> (\"E\").at (0, 0)[0] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x27e,"void (anonymous namespace)::testRenameChannels()");
    }
    __assert_fail("img.level (1).typedChannel<half> (\"D\").at (0, 0)[0] == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x27d,"void (anonymous namespace)::testRenameChannels()");
  }
  __assert_fail("img.level (0).typedChannel<half> (\"D\").at (0, 0)[0] == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                ,0x278,"void (anonymous namespace)::testRenameChannels()");
}

Assistant:

void
testRenameChannels ()
{
    cout << "renaming multiple channels at the same time" << endl;

    DeepImage img (Box2i (V2i (0, 0), V2i (10, 10)), MIPMAP_LEVELS);
    img.insertChannel ("A", HALF);
    img.insertChannel ("B", HALF);
    img.insertChannel ("C", HALF);
    img.insertChannel ("D", HALF);

    img.level (0).sampleCounts ().set (0, 0, 1);
    img.level (0).typedChannel<half> ("A").at (0, 0)[0] = 1;
    img.level (0).typedChannel<half> ("B").at (0, 0)[0] = 2;
    img.level (0).typedChannel<half> ("C").at (0, 0)[0] = 3;
    img.level (0).typedChannel<half> ("D").at (0, 0)[0] = 4;

    img.level (1).sampleCounts ().set (0, 0, 1);
    img.level (1).typedChannel<half> ("A").at (0, 0)[0] = 1;
    img.level (1).typedChannel<half> ("B").at (0, 0)[0] = 2;
    img.level (1).typedChannel<half> ("C").at (0, 0)[0] = 3;
    img.level (1).typedChannel<half> ("D").at (0, 0)[0] = 4;

    {
        RenamingMap oldToNewNames;
        oldToNewNames["A"] = "B";
        oldToNewNames["B"] = "A";
        oldToNewNames["C"] = "E";
        oldToNewNames["X"] = "Y";

        img.renameChannels (oldToNewNames);
    }

    assert (img.level (0).findChannel ("A") != 0);
    assert (img.level (0).findChannel ("B") != 0);
    assert (img.level (0).findChannel ("C") == 0);
    assert (img.level (0).findChannel ("D") != 0);
    assert (img.level (0).findChannel ("E") != 0);

    assert (img.level (0).typedChannel<half> ("A").at (0, 0)[0] == 2);
    assert (img.level (0).typedChannel<half> ("B").at (0, 0)[0] == 1);
    assert (img.level (0).typedChannel<half> ("D").at (0, 0)[0] == 4);
    assert (img.level (0).typedChannel<half> ("E").at (0, 0)[0] == 3);

    assert (img.level (1).typedChannel<half> ("A").at (0, 0)[0] == 2);
    assert (img.level (1).typedChannel<half> ("B").at (0, 0)[0] == 1);
    assert (img.level (1).typedChannel<half> ("D").at (0, 0)[0] == 4);
    assert (img.level (1).typedChannel<half> ("E").at (0, 0)[0] == 3);

    bool caught = false;
    try
    {
        RenamingMap oldToNewNames;
        oldToNewNames["A"] = "F";
        oldToNewNames["B"] = "F"; // duplicate new name "F"

        img.renameChannels (oldToNewNames);
        assert (false);
    }
    catch (...)
    {
        // expecting exception
        caught = true;
    }
    assert (caught);

    caught = false;
    try
    {
        RenamingMap oldToNewNames;
        oldToNewNames["A"] = "B"; // duplicate new name "B"

        img.renameChannels (oldToNewNames);
        assert (false);
    }
    catch (...)
    {
        // expecting exception
        caught = true;
    }
    assert (caught);
}